

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O2

CrispyValue std_num(CrispyValue *value,Vm *vm)

{
  Object *pOVar1;
  size_t __n;
  object_t *__src;
  long lVar2;
  ObjString *object;
  char *__nptr;
  double value_00;
  CrispyValue CVar3;
  undefined8 uStack_30;
  char acStack_28 [8];
  
  if ((value->type == OBJECT) && (pOVar1 = (value->field_1).o_value, pOVar1->type == OBJ_STRING)) {
    lVar2 = -(*(long *)(pOVar1 + 1) + 0x10U & 0xfffffffffffffff0);
    __nptr = acStack_28 + lVar2;
    __n = *(size_t *)(pOVar1 + 1);
    __src = pOVar1[1].next;
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x106418;
    memcpy(__nptr,__src,__n);
    __nptr[__n] = '\0';
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x106427;
    value_00 = strtod(__nptr,(char **)0x0);
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x10642c;
    CVar3 = create_number(value_00);
    return CVar3;
  }
  vm->err_flag = true;
  uStack_30 = 0x1063db;
  object = new_string(vm,"num() can only be used on strings",0x21);
  CVar3 = create_object(&object->object);
  return CVar3;
}

Assistant:

CrispyValue std_num(CrispyValue *value, Vm *vm) {
    if (value[0].type != OBJECT || value[0].o_value->type != OBJ_STRING) {
        vm->err_flag = true;
        return create_object((Object *) new_string(vm, "num() can only be used on strings", 33));
    }

    ObjString *string = (ObjString *) value[0].o_value;
    char temp[string->length + 1];
    memcpy(temp, string->start, string->length);
    temp[string->length] = '\0';

    double res;
    res = strtod(temp, NULL);

    return create_number(res);
}